

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O3

void update_state_and_predict_cb(ftrl *b,single_learner *param_2,example *ec)

{
  float fVar1;
  double dVar2;
  
  (b->data).predict = 0.0;
  (b->data).normalized_squared_norm_x = 0.0;
  GD::foreach_feature<update_data,_float_&,_&inner_update_cb_state_and_predict>(b->all,ec,&b->data);
  b->all->normalized_sum_norm_x =
       (double)(b->data).normalized_squared_norm_x * (double)ec->weight +
       b->all->normalized_sum_norm_x;
  dVar2 = (double)ec->weight + b->total_weight;
  b->total_weight = dVar2;
  fVar1 = (b->data).predict / (float)((b->all->normalized_sum_norm_x + 1e-06) / dVar2);
  ec->partial_prediction = fVar1;
  fVar1 = GD::finalize_prediction(b->all->sd,fVar1);
  (ec->pred).scalar = fVar1;
  return;
}

Assistant:

void update_state_and_predict_cb(ftrl& b, single_learner&, example& ec)
{
  b.data.predict = 0;
  b.data.normalized_squared_norm_x = 0;

  GD::foreach_feature<update_data, inner_update_cb_state_and_predict>(*b.all, ec, b.data);

  b.all->normalized_sum_norm_x += ((double)ec.weight) * b.data.normalized_squared_norm_x;
  b.total_weight += ec.weight;

  ec.partial_prediction = b.data.predict/((float)((b.all->normalized_sum_norm_x + 1e-6)/b.total_weight));

  ec.pred.scalar = GD::finalize_prediction(b.all->sd, ec.partial_prediction);
}